

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

void __thiscall PoolList<Client>::~PoolList(PoolList<Client> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  PoolList<Client> *pPVar3;
  
  pPVar3 = this;
  while (pPVar3 = (PoolList<Client> *)(pPVar3->_begin).item,
        pPVar3 != (PoolList<Client> *)&this->endItem) {
    Client::~Client((Client *)&pPVar3->_size);
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  return;
}

Assistant:

~PoolList()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      ((T*)(i + 1))->~T();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }